

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp_server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  typed_value<unsigned_short,_char> *ptVar1;
  char *pcVar2;
  size_type sVar3;
  ostream *poVar4;
  time_t tVar5;
  any *operand;
  unsigned_short *puVar6;
  allocator<char> local_289;
  long *local_288 [4];
  io_service io_service;
  thread worker;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_238;
  rudp_server server;
  variables_map values;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_128 [144];
  options_description opts;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&server,"Options",(allocator<char> *)&values);
  boost::program_options::options_description::options_description
            (&opts,(string *)&server,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&server);
  server.io_service = (io_service *)boost::program_options::options_description::add_options();
  ptVar1 = boost::program_options::value<unsigned_short>();
  _values = 8000;
  ptVar1 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar1,(unsigned_short *)&values);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&server,(value_semantic *)"port,p",(char *)ptVar1);
  boost::program_options::options_description_easy_init::operator()(pcVar2,"help,h");
  boost::program_options::variables_map::variables_map(&values);
  local_238.super_function_base.vtable = (vtable_base *)0x0;
  local_238.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_238.super_function_base.functor._8_8_ = 0;
  local_238.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&server,argc,argv,&opts,0,&local_238);
  boost::program_options::store((basic_parsed_options *)&server,&values,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&server);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&server,"help",(allocator<char> *)local_288);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_128,(key_type *)&server);
  std::__cxx11::string::~string((string *)&server);
  if (sVar3 == 0) {
    tVar5 = time((time_t *)0x0);
    srand((uint)tVar5);
    boost::asio::io_context::io_context(&io_service);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_288,"port",&local_289);
    operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&values);
    puVar6 = boost::any_cast<unsigned_short_const&>(operand);
    worker._M_id._M_thread = (id)0;
    rudp::rudp_server::rudp_server
              (&server,&io_service,*puVar6,
               (function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
                *)&worker);
    std::_Function_base::~_Function_base((_Function_base *)&worker);
    std::__cxx11::string::~string((string *)local_288);
    worker._M_id._M_thread = (id)0;
    local_288[0] = (long *)operator_new(0x10);
    *local_288[0] = (long)&PTR___State_00158b08;
    local_288[0][1] = (long)&io_service;
    std::thread::_M_start_thread(&worker,local_288,0);
    if (local_288[0] != (long *)0x0) {
      (**(code **)(*local_288[0] + 8))();
    }
    std::thread::join();
    std::thread::~thread(&worker);
    rudp::rudp_server::~rudp_server(&server);
    boost::asio::execution_context::~execution_context(&io_service.super_execution_context);
  }
  else {
    poVar4 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&opts);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  boost::program_options::variables_map::~variables_map(&values);
  boost::program_options::options_description::~options_description(&opts);
  return 0;
}

Assistant:

int main( int argc, char *argv[] ) {
  namespace po = boost::program_options;
  po::options_description opts( "Options" );
  opts.add_options()
    ( "port,p", po::value< uint16_t >()->default_value( 8000 ), "port" )
    ( "help,h", "display this message" );
  po::variables_map values;
  po::store( po::parse_command_line( argc, argv, opts ), values );
  if( values.count("help") ) {
    std::cout << opts << std::endl;
    return 0;
  }
  srand( time( nullptr ) );
  boost::asio::io_service io_service;
  rudp::rudp_server server( io_service, values[ "port" ].as< uint16_t >(),
    []( rudp::rudp_server &self, uint32_t ident, const rudp::buffers_ptr_t &bufs ) {
      std::cout << "received" << std::endl;
      for( auto &buf: *bufs ) {
        if( buf->size() >= 2 ) {
          const auto header_size = (*buf)[ 1 ];
          if( size_t( header_size ) < buf->size() )
            self.send( ident, std::next( buf->data(), header_size ), std::next( buf->data(), buf->size() ), []( bool status ) {
	      if( status ) { std::cout << "responded" << std::endl; } else { std::cout << "failed" << std::endl; }
	    } );
        }
      }
    }
  );
  std::thread worker( [&]() { io_service.run(); } );
  worker.join();
}